

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_phmap::priv::(anonymous_namespace)::CustomAlloc<long>_>::iterator,_bool>
* __thiscall
phmap::priv::
raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,phmap::Hash<long>,std::equal_to<long>,phmap::priv::(anonymous_namespace)::CustomAlloc<long>>
::emplace_decomposable<long,long&>
          (pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_phmap::priv::(anonymous_namespace)::CustomAlloc<long>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,phmap::Hash<long>,std::equal_to<long>,phmap::priv::(anonymous_namespace)::CustomAlloc<long>>
          *this,long *key,size_t hashval,long *args)

{
  size_t i;
  ctrl_t h;
  bool local_59;
  iterator local_58;
  bool local_41;
  iterator local_40;
  size_t local_30;
  size_t offset;
  long *args_local;
  size_t hashval_local;
  long *key_local;
  raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_phmap::priv::(anonymous_namespace)::CustomAlloc<long>_>
  *this_local;
  
  offset = (size_t)args;
  args_local = (long *)hashval;
  hashval_local = (size_t)key;
  key_local = (long *)this;
  local_30 = raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_phmap::priv::(anonymous_namespace)::CustomAlloc<long>_>
             ::_find_key<long>((raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_phmap::priv::(anonymous_namespace)::CustomAlloc<long>_>
                                *)this,key,hashval);
  if (local_30 == 0xffffffffffffffff) {
    local_30 = raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_phmap::priv::(anonymous_namespace)::CustomAlloc<long>_>
               ::prepare_insert((raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_phmap::priv::(anonymous_namespace)::CustomAlloc<long>_>
                                 *)this,(size_t)args_local);
    emplace_at<long&>(this,local_30,(long *)offset);
    i = local_30;
    h = H2((size_t)args_local);
    raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_phmap::priv::(anonymous_namespace)::CustomAlloc<long>_>
    ::set_ctrl((raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_phmap::priv::(anonymous_namespace)::CustomAlloc<long>_>
                *)this,i,h);
    local_40 = raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_phmap::priv::(anonymous_namespace)::CustomAlloc<long>_>
               ::iterator_at((raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_phmap::priv::(anonymous_namespace)::CustomAlloc<long>_>
                              *)this,local_30);
    local_41 = true;
    std::
    pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_phmap::priv::(anonymous_namespace)::CustomAlloc<long>_>::iterator,_bool>
    ::
    pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_phmap::priv::(anonymous_namespace)::CustomAlloc<long>_>::iterator,_bool,_true>
              (__return_storage_ptr__,&local_40,&local_41);
  }
  else {
    local_58 = raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_phmap::priv::(anonymous_namespace)::CustomAlloc<long>_>
               ::iterator_at((raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_phmap::priv::(anonymous_namespace)::CustomAlloc<long>_>
                              *)this,local_30);
    local_59 = false;
    std::
    pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_phmap::priv::(anonymous_namespace)::CustomAlloc<long>_>::iterator,_bool>
    ::
    pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_phmap::priv::(anonymous_namespace)::CustomAlloc<long>_>::iterator,_bool,_true>
              (__return_storage_ptr__,&local_58,&local_59);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> emplace_decomposable(const K& key, size_t hashval, 
                                                   Args&&... args)
    {
        size_t offset = _find_key(key, hashval);
        if (offset == (size_t)-1) {
            offset = prepare_insert(hashval);
            emplace_at(offset, std::forward<Args>(args)...);
            this->set_ctrl(offset, H2(hashval));
            return {iterator_at(offset), true};
        }
        return {iterator_at(offset), false};
    }